

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symlink.cpp
# Opt level: O2

bool fs_create_symlink(string_view target,string_view link)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  string_view path1;
  string_view path2;
  string_view fname;
  error_code local_a0;
  string_view link_local;
  string_view target_local;
  path local_70;
  path local_48;
  
  sVar2 = link._M_len;
  sVar4 = target._M_len;
  local_a0._M_value = 0;
  link_local._M_len = sVar2;
  link_local._M_str = link._M_str;
  target_local._M_len = sVar4;
  target_local._M_str = target._M_str;
  local_a0._M_cat = (error_category *)std::_V2::system_category();
  if ((sVar4 == 0) || (sVar2 == 0)) {
    local_a0._M_cat = (error_category *)std::_V2::generic_category();
    local_a0._M_value = 0x16;
    pcVar3 = target._M_str;
    pcVar5 = link._M_str;
  }
  else {
    bVar1 = fs_is_dir(target);
    if (bVar1) {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_70,&target_local,auto_format);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_48,&link_local,auto_format);
      std::filesystem::create_directory_symlink(&local_70,&local_48,&local_a0);
    }
    else {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_70,&target_local,auto_format);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_48,&link_local,auto_format);
      std::filesystem::create_symlink(&local_70,&local_48,&local_a0);
    }
    std::filesystem::__cxx11::path::~path(&local_48);
    std::filesystem::__cxx11::path::~path(&local_70);
    pcVar3 = target_local._M_str;
    sVar2 = link_local._M_len;
    pcVar5 = link_local._M_str;
    sVar4 = target_local._M_len;
    if (local_a0._M_value == 0) {
      return true;
    }
  }
  path1._M_str = pcVar3;
  path1._M_len = sVar4;
  path2._M_str = pcVar5;
  path2._M_len = sVar2;
  fname._M_str = "fs_create_symlink";
  fname._M_len = 0x11;
  fs_print_error(path1,path2,fname,&local_a0);
  return false;
}

Assistant:

bool fs_create_symlink(std::string_view target, std::string_view link)
{
  // create symlink to file or directory

  std::error_code ec;

  // confusing program errors if target is "" -- we'd never make such a symlink in real use.
  // macOS needs empty check to avoid SIGABRT

  if(target.empty() || link.empty()) FFS_UNLIKELY
    ec = std::make_error_code(std::errc::invalid_argument);
  else {
#if defined(__MINGW32__) || (defined(_WIN32) && !defined(HAVE_CXX_FILESYSTEM))

  DWORD p = SYMBOLIC_LINK_FLAG_ALLOW_UNPRIVILEGED_CREATE;

  if(fs_is_dir(target.data()))
    p |= SYMBOLIC_LINK_FLAG_DIRECTORY;

  if(CreateSymbolicLinkA(link.data(), target.data(), p))  FFS_LIKELY
    return true;

#elif defined(HAVE_CXX_FILESYSTEM)

  fs_is_dir(target)
    ? std::filesystem::create_directory_symlink(target, link, ec)
    : std::filesystem::create_symlink(target, link, ec);

  if(!ec) FFS_LIKELY
    return true;

#else
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man2/symlink.2.html
  // https://linux.die.net/man/3/symlink
  if(symlink(target.data(), link.data()) == 0)  FFS_LIKELY
    return true;
#endif
  }

  fs_print_error(target, link, __func__, ec);
  return false;
}